

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# woff2_dec.cc
# Opt level: O0

vector<woff2::Table_*,_std::allocator<woff2::Table_*>_> *
woff2::anon_unknown_0::Tables
          (vector<woff2::Table_*,_std::allocator<woff2::Table_*>_> *__return_storage_ptr__,
          WOFF2Header *hdr,size_t font_index)

{
  bool bVar1;
  reference pvVar2;
  reference puVar3;
  reference local_88;
  reference local_80;
  Table *table;
  iterator __end3_1;
  iterator __begin3_1;
  vector<woff2::Table,_std::allocator<woff2::Table>_> *__range3_1;
  reference local_50;
  ushort local_42;
  iterator iStack_40;
  unsigned_short index;
  iterator __end3;
  iterator __begin3;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range3;
  size_t font_index_local;
  WOFF2Header *hdr_local;
  vector<woff2::Table_*,_std::allocator<woff2::Table_*>_> *tables;
  
  std::vector<woff2::Table_*,_std::allocator<woff2::Table_*>_>::vector(__return_storage_ptr__);
  if (hdr->header_version == 0) {
    __end3_1 = std::vector<woff2::Table,_std::allocator<woff2::Table>_>::begin(&hdr->tables);
    table = (Table *)std::vector<woff2::Table,_std::allocator<woff2::Table>_>::end(&hdr->tables);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<woff2::Table_*,_std::vector<woff2::Table,_std::allocator<woff2::Table>_>_>
                               *)&table), bVar1) {
      local_88 = __gnu_cxx::
                 __normal_iterator<woff2::Table_*,_std::vector<woff2::Table,_std::allocator<woff2::Table>_>_>
                 ::operator*(&__end3_1);
      local_80 = local_88;
      std::vector<woff2::Table_*,_std::allocator<woff2::Table_*>_>::push_back
                (__return_storage_ptr__,&local_88);
      __gnu_cxx::
      __normal_iterator<woff2::Table_*,_std::vector<woff2::Table,_std::allocator<woff2::Table>_>_>::
      operator++(&__end3_1);
    }
  }
  else {
    pvVar2 = std::
             vector<woff2::(anonymous_namespace)::TtcFont,_std::allocator<woff2::(anonymous_namespace)::TtcFont>_>
             ::operator[](&hdr->ttc_fonts,font_index);
    __end3 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin
                       (&pvVar2->table_indices);
    iStack_40 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end
                          (&pvVar2->table_indices);
    while (bVar1 = __gnu_cxx::operator!=(&__end3,&stack0xffffffffffffffc0), bVar1) {
      puVar3 = __gnu_cxx::
               __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
               ::operator*(&__end3);
      local_42 = *puVar3;
      local_50 = std::vector<woff2::Table,_std::allocator<woff2::Table>_>::operator[]
                           (&hdr->tables,(ulong)local_42);
      std::vector<woff2::Table_*,_std::allocator<woff2::Table_*>_>::push_back
                (__return_storage_ptr__,&local_50);
      __gnu_cxx::
      __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
      ::operator++(&__end3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Table*> Tables(WOFF2Header* hdr, size_t font_index) {
  std::vector<Table*> tables;
  if (PREDICT_FALSE(hdr->header_version)) {
    for (auto index : hdr->ttc_fonts[font_index].table_indices) {
      tables.push_back(&hdr->tables[index]);
    }
  } else {
    for (auto& table : hdr->tables) {
      tables.push_back(&table);
    }
  }
  return tables;
}